

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arenaViolation.c
# Opt level: O1

Vec_Ptr_t * collectBarrierDisjunctions(Aig_Man_t *pAigOld,Aig_Man_t *pAigNew,Vec_Ptr_t *vBarriers)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  void *pvVar4;
  Vec_Ptr_t *pVVar5;
  void **ppvVar6;
  Aig_Obj_t *p0;
  long lVar7;
  ulong uVar8;
  Aig_Man_t *pAig;
  Aig_Man_t *__ptr;
  int iVar9;
  long lVar10;
  Aig_Obj_t *p1;
  
  if (vBarriers != (Vec_Ptr_t *)0x0) {
    uVar1 = vBarriers->nSize;
    if (0 < (long)(int)uVar1) {
      pVVar5 = (Vec_Ptr_t *)malloc(0x10);
      uVar8 = 8;
      if (8 < uVar1) {
        uVar8 = (ulong)uVar1;
      }
      pVVar5->nSize = 0;
      pVVar5->nCap = (int)uVar8;
      pAig = (Aig_Man_t *)(uVar8 << 3);
      ppvVar6 = (void **)malloc((size_t)pAig);
      pVVar5->pArray = ppvVar6;
      lVar7 = 0;
      do {
        if (vBarriers->nSize <= lVar7) {
LAB_005b1758:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecPtr.h"
                        ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
        }
        pvVar4 = vBarriers->pArray[lVar7];
        if (*(int *)((long)pvVar4 + 4) < 1) {
          __assert_fail("Vec_IntSize( vIthBarrier ) >= 1",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/live/arenaViolation.c"
                        ,0x8e,
                        "Vec_Ptr_t *collectBarrierDisjunctions(Aig_Man_t *, Aig_Man_t *, Vec_Ptr_t *)"
                       );
        }
        p1 = (Aig_Obj_t *)((ulong)pAigNew->pConst1 ^ 1);
        if (0 < *(int *)((long)pvVar4 + 4)) {
          lVar10 = 0;
          do {
            iVar9 = *(int *)(*(long *)((long)pvVar4 + 8) + lVar10 * 4);
            if (((long)iVar9 < 0) || (pAigOld->vCos->nSize <= iVar9)) goto LAB_005b1758;
            p0 = driverToPoNew(pAig,(Aig_Obj_t *)pAigOld->vCos->pArray[iVar9]);
            pAig = pAigNew;
            p1 = Aig_Or(pAigNew,p0,p1);
            lVar10 = lVar10 + 1;
          } while (lVar10 < *(int *)((long)pvVar4 + 4));
        }
        if (p1 == (Aig_Obj_t *)0x0) {
          __assert_fail("pObjBarrier",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/live/arenaViolation.c"
                        ,0x98,
                        "Vec_Ptr_t *collectBarrierDisjunctions(Aig_Man_t *, Aig_Man_t *, Vec_Ptr_t *)"
                       );
        }
        uVar2 = pVVar5->nSize;
        uVar3 = pVVar5->nCap;
        if (uVar2 == uVar3) {
          if ((int)uVar3 < 0x10) {
            pAig = (Aig_Man_t *)pVVar5->pArray;
            if (pAig == (Aig_Man_t *)0x0) {
              pAig = (Aig_Man_t *)0x80;
              ppvVar6 = (void **)malloc(0x80);
            }
            else {
              ppvVar6 = (void **)realloc(pAig,0x80);
            }
            iVar9 = 0x10;
          }
          else {
            iVar9 = uVar3 * 2;
            if (iVar9 <= (int)uVar3) goto LAB_005b170d;
            __ptr = (Aig_Man_t *)pVVar5->pArray;
            pAig = (Aig_Man_t *)((ulong)uVar3 << 4);
            if (__ptr == (Aig_Man_t *)0x0) {
              ppvVar6 = (void **)malloc((size_t)pAig);
            }
            else {
              ppvVar6 = (void **)realloc(__ptr,(size_t)pAig);
              pAig = __ptr;
            }
          }
          pVVar5->pArray = ppvVar6;
          pVVar5->nCap = iVar9;
        }
LAB_005b170d:
        pVVar5->nSize = uVar2 + 1;
        pVVar5->pArray[(int)uVar2] = p1;
        lVar7 = lVar7 + 1;
        if (lVar7 == (int)uVar1) {
          if (pVVar5->nSize == uVar1) {
            return pVVar5;
          }
          __assert_fail("Vec_PtrSize( vNewBarrierSignals ) == barrierCount",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/live/arenaViolation.c"
                        ,0x9b,
                        "Vec_Ptr_t *collectBarrierDisjunctions(Aig_Man_t *, Aig_Man_t *, Vec_Ptr_t *)"
                       );
        }
      } while( true );
    }
  }
  return (Vec_Ptr_t *)0x0;
}

Assistant:

Vec_Ptr_t *collectBarrierDisjunctions(Aig_Man_t *pAigOld, Aig_Man_t *pAigNew, Vec_Ptr_t *vBarriers)
{
	int barrierCount, i, j, jElem;
	Vec_Int_t *vIthBarrier;
	Aig_Obj_t *pObjBarrier, *pObjCurr, *pObjTargetPoOld;
	Vec_Ptr_t *vNewBarrierSignals;

	if( vBarriers == NULL )
		return NULL;
	barrierCount = Vec_PtrSize( vBarriers );
	if( barrierCount <= 0 )
		return NULL;

	vNewBarrierSignals = Vec_PtrAlloc( barrierCount );

	for( i=0; i<barrierCount; i++ )
	{
		vIthBarrier = (Vec_Int_t *)Vec_PtrEntry( vBarriers, i );
		assert( Vec_IntSize( vIthBarrier ) >= 1 );
		pObjBarrier = Aig_Not(Aig_ManConst1(pAigNew));
		Vec_IntForEachEntry( vIthBarrier, jElem, j )
		{
			pObjTargetPoOld = Aig_ManCo( pAigOld, jElem );
			//Aig_ObjPrint( pAigOld, pObjTargetPoOld );
			//printf("\n");
			pObjCurr = driverToPoNew( pAigOld, pObjTargetPoOld );
			pObjBarrier = Aig_Or( pAigNew, pObjCurr, pObjBarrier );
		}
		assert( pObjBarrier );
		Vec_PtrPush(vNewBarrierSignals, pObjBarrier);
	}
	assert( Vec_PtrSize( vNewBarrierSignals ) == barrierCount );

	return vNewBarrierSignals;
}